

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusStationary.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
PerseusStationary::GetImmediateRewardBeliefSet
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,PerseusStationary *this)

{
  BeliefSet *Beliefs;
  _func_int *p_Var1;
  PlanningUnitDecPOMDPDiscrete *pu;
  ValueFunctionPOMDPDiscrete local_30;
  
  Beliefs = *(BeliefSet **)&(this->super_Perseus).field_0xc0;
  p_Var1 = (this->super_Perseus)._vptr_Perseus[-3];
  pu = *(PlanningUnitDecPOMDPDiscrete **)((long)&(this->super_Perseus)._m_verbose + (long)p_Var1);
  if (pu == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pu = *(PlanningUnitDecPOMDPDiscrete **)
          ((long)&(this->super_Perseus)._m_bestValue + (long)p_Var1);
  }
  AlphaVectorPlanning::GetImmediateRewardValueFunction(&local_30,pu);
  BeliefValue::GetValues(__return_storage_ptr__,Beliefs,&local_30);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> PerseusStationary::GetImmediateRewardBeliefSet() const
{
    return(BeliefValue::GetValues(*_m_beliefs,
                                  AlphaVectorPlanning::
                                  GetImmediateRewardValueFunction(GetPU())));
}